

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O3

void __thiscall BloomFilter::BloomFilter(BloomFilter *this,ifstream *in)

{
  char cVar1;
  long lVar2;
  long lVar3;
  char (*__range1) [10240];
  ulong uVar4;
  ulong uVar5;
  _WordT _Var6;
  long lVar7;
  char buffer [10240];
  char local_2818 [10240];
  
  lVar7 = 0;
  memset(this,0,0x2800);
  std::istream::seekg((long)in,0x20);
  std::istream::read((char *)in,(long)local_2818);
  lVar2 = 0;
  do {
    cVar1 = local_2818[lVar2];
    lVar3 = 0;
    do {
      uVar5 = (int)lVar7 + lVar3;
      uVar4 = uVar5 >> 6;
      uVar5 = 1L << ((byte)uVar5 & 0x3f);
      if (((uint)(int)cVar1 >> ((uint)lVar3 & 0x1f) & 1) == 0) {
        _Var6 = ~uVar5 & (this->bits).super__Base_bitset<1280UL>._M_w[uVar4];
      }
      else {
        _Var6 = uVar5 | (this->bits).super__Base_bitset<1280UL>._M_w[uVar4];
      }
      (this->bits).super__Base_bitset<1280UL>._M_w[uVar4] = _Var6;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 8);
    lVar2 = lVar2 + 1;
    lVar7 = (int)lVar7 + lVar3;
  } while (lVar2 != 0x2800);
  return;
}

Assistant:

BloomFilter::BloomFilter(ifstream &in) {
  in.seekg(32, ifstream::beg);
  char buffer[10240];
  in.read(buffer, 10240);
  int p = 0;
  for (char c : buffer) {
    for (int i = 0; i < 8; i++) bits[p++] = (c >> i) & 1;
  }
}